

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

bool absl::cord_internal::operator==(InlineData *lhs,InlineData *rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  InlineData *rhs_local;
  InlineData *lhs_local;
  
  cVar7 = -((lhs->rep_).field_0.data[0] == (rhs->rep_).field_0.data[0]);
  cVar8 = -((lhs->rep_).field_0.data[1] == (rhs->rep_).field_0.data[1]);
  cVar9 = -((lhs->rep_).field_0.data[2] == (rhs->rep_).field_0.data[2]);
  cVar10 = -((lhs->rep_).field_0.data[3] == (rhs->rep_).field_0.data[3]);
  cVar11 = -((lhs->rep_).field_0.data[4] == (rhs->rep_).field_0.data[4]);
  cVar12 = -((lhs->rep_).field_0.data[5] == (rhs->rep_).field_0.data[5]);
  cVar13 = -((lhs->rep_).field_0.data[6] == (rhs->rep_).field_0.data[6]);
  cVar14 = -((lhs->rep_).field_0.data[7] == (rhs->rep_).field_0.data[7]);
  cVar15 = -((lhs->rep_).field_0.data[8] == (rhs->rep_).field_0.data[8]);
  cVar16 = -((lhs->rep_).field_0.data[9] == (rhs->rep_).field_0.data[9]);
  cVar17 = -((lhs->rep_).field_0.data[10] == (rhs->rep_).field_0.data[10]);
  cVar18 = -((lhs->rep_).field_0.data[0xb] == (rhs->rep_).field_0.data[0xb]);
  cVar19 = -((lhs->rep_).field_0.data[0xc] == (rhs->rep_).field_0.data[0xc]);
  cVar20 = -((lhs->rep_).field_0.data[0xd] == (rhs->rep_).field_0.data[0xd]);
  cVar21 = -((lhs->rep_).field_0.data[0xe] == (rhs->rep_).field_0.data[0xe]);
  bVar22 = -((lhs->rep_).field_0.data[0xf] == (rhs->rep_).field_0.data[0xf]);
  auVar1[1] = cVar8;
  auVar1[0] = cVar7;
  auVar1[2] = cVar9;
  auVar1[3] = cVar10;
  auVar1[4] = cVar11;
  auVar1[5] = cVar12;
  auVar1[6] = cVar13;
  auVar1[7] = cVar14;
  auVar1[8] = cVar15;
  auVar1[9] = cVar16;
  auVar1[10] = cVar17;
  auVar1[0xb] = cVar18;
  auVar1[0xc] = cVar19;
  auVar1[0xd] = cVar20;
  auVar1[0xe] = cVar21;
  auVar1[0xf] = bVar22;
  auVar2[1] = cVar8;
  auVar2[0] = cVar7;
  auVar2[2] = cVar9;
  auVar2[3] = cVar10;
  auVar2[4] = cVar11;
  auVar2[5] = cVar12;
  auVar2[6] = cVar13;
  auVar2[7] = cVar14;
  auVar2[8] = cVar15;
  auVar2[9] = cVar16;
  auVar2[10] = cVar17;
  auVar2[0xb] = cVar18;
  auVar2[0xc] = cVar19;
  auVar2[0xd] = cVar20;
  auVar2[0xe] = cVar21;
  auVar2[0xf] = bVar22;
  auVar6[1] = cVar10;
  auVar6[0] = cVar9;
  auVar6[2] = cVar11;
  auVar6[3] = cVar12;
  auVar6[4] = cVar13;
  auVar6[5] = cVar14;
  auVar6[6] = cVar15;
  auVar6[7] = cVar16;
  auVar6[8] = cVar17;
  auVar6[9] = cVar18;
  auVar6[10] = cVar19;
  auVar6[0xb] = cVar20;
  auVar6[0xc] = cVar21;
  auVar6[0xd] = bVar22;
  auVar5[1] = cVar11;
  auVar5[0] = cVar10;
  auVar5[2] = cVar12;
  auVar5[3] = cVar13;
  auVar5[4] = cVar14;
  auVar5[5] = cVar15;
  auVar5[6] = cVar16;
  auVar5[7] = cVar17;
  auVar5[8] = cVar18;
  auVar5[9] = cVar19;
  auVar5[10] = cVar20;
  auVar5[0xb] = cVar21;
  auVar5[0xc] = bVar22;
  auVar4[1] = cVar12;
  auVar4[0] = cVar11;
  auVar4[2] = cVar13;
  auVar4[3] = cVar14;
  auVar4[4] = cVar15;
  auVar4[5] = cVar16;
  auVar4[6] = cVar17;
  auVar4[7] = cVar18;
  auVar4[8] = cVar19;
  auVar4[9] = cVar20;
  auVar4[10] = cVar21;
  auVar4[0xb] = bVar22;
  auVar3[1] = cVar13;
  auVar3[0] = cVar12;
  auVar3[2] = cVar14;
  auVar3[3] = cVar15;
  auVar3[4] = cVar16;
  auVar3[5] = cVar17;
  auVar3[6] = cVar18;
  auVar3[7] = cVar19;
  auVar3[8] = cVar20;
  auVar3[9] = cVar21;
  auVar3[10] = bVar22;
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                  (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                  (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                  (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                  (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19,
                                                  CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                 7) & 1) << 6 |
                  (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19,
                                                  CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                 (ushort)(bVar22 >> 7) << 0xf) == 0xffff;
}

Assistant:

bool operator==(const InlineData& lhs, const InlineData& rhs) {
#ifdef ABSL_INTERNAL_CORD_HAVE_SANITIZER
    const Rep l = lhs.rep_.SanitizerSafeCopy();
    const Rep r = rhs.rep_.SanitizerSafeCopy();
    return memcmp(&l, &r, sizeof(l)) == 0;
#else
    return memcmp(&lhs, &rhs, sizeof(lhs)) == 0;
#endif
  }